

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mode.cpp
# Opt level: O0

AggregateFunction *
duckdb::GetTypedModeFunction<duckdb::interval_t,duckdb::ModeStandard<duckdb::interval_t>>
          (LogicalType *type)

{
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  AggregateFunction *func;
  AggregateFunction *this;
  AggregateFunction *input_type;
  
  this = in_RDI;
  input_type = in_RDI;
  LogicalType::LogicalType((LogicalType *)in_RDI,(LogicalType *)in_RDI);
  LogicalType::LogicalType((LogicalType *)this,(LogicalType *)in_RDI);
  AggregateFunction::
  UnaryAggregateDestructor<duckdb::ModeState<duckdb::interval_t,duckdb::ModeStandard<duckdb::interval_t>>,duckdb::interval_t,duckdb::interval_t,duckdb::ModeFunction<duckdb::ModeStandard<duckdb::interval_t>>,(duckdb::AggregateDestructorType)1>
            ((LogicalType *)input_type,in_RSI);
  LogicalType::~LogicalType((LogicalType *)0x1ccb5be);
  LogicalType::~LogicalType((LogicalType *)0x1ccb5c8);
  in_RDI->window =
       ModeFunction<duckdb::ModeStandard<duckdb::interval_t>>::
       Window<duckdb::ModeState<duckdb::interval_t,duckdb::ModeStandard<duckdb::interval_t>>,duckdb::interval_t,duckdb::interval_t>
  ;
  return this;
}

Assistant:

AggregateFunction GetTypedModeFunction(const LogicalType &type) {
	using STATE = ModeState<INPUT_TYPE, TYPE_OP>;
	using OP = ModeFunction<TYPE_OP>;
	auto func =
	    AggregateFunction::UnaryAggregateDestructor<STATE, INPUT_TYPE, INPUT_TYPE, OP, AggregateDestructorType::LEGACY>(
	        type, type);
	func.window = OP::template Window<STATE, INPUT_TYPE, INPUT_TYPE>;
	return func;
}